

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int launchCrazySAX(uint test,int fail)

{
  int iVar1;
  uint local_18;
  int err;
  int res;
  int fail_local;
  uint test_local;
  
  crazy_indx = test;
  iVar1 = saxTest("crazy::test",0x988680,0,fail);
  if (iVar1 != 0) {
    nb_errors = nb_errors + 1;
  }
  local_18 = (uint)(iVar1 != 0);
  if (tests_quiet == 0) {
    fprintf(_stderr,"%c",(ulong)(uint)(int)crazy[test]);
  }
  return local_18;
}

Assistant:

static int
launchCrazySAX(unsigned int test, int fail) {
    int res = 0, err = 0;

    crazy_indx = test;

    res = saxTest("crazy::test", XML_MAX_LOOKUP_LIMIT - CHUNK, 0, fail);
    if (res != 0) {
        nb_errors++;
        err++;
    }
    if (tests_quiet == 0)
        fprintf(stderr, "%c", crazy[test]);

    return(err);
}